

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall Transaction_GetRwUInt64_Test::TestBody(Transaction_GetRwUInt64_Test *this)

{
  bool bVar1;
  element_type_conflict1 *peVar2;
  element_type *rhs;
  char *message;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  shared_ptr<unsigned_long> ptr;
  typed_address<unsigned_long> local_a8;
  extent<unsigned_long> local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  address addr;
  unique_lock<mock_mutex> local_78;
  undefined1 local_68 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 auStack_28 [7];
  mock_mutex mutex;
  extent<unsigned_long> extent;
  uint64_t expected;
  Transaction_GetRwUInt64_Test *this_local;
  
  extent.size = 0x10000000000;
  pstore::extent<unsigned_long>::extent((extent<unsigned_long> *)auStack_28);
  std::unique_lock<mock_mutex>::unique_lock(&local_78,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_68,
          &(this->super_Transaction).db_.super_database,&local_78);
  std::unique_lock<mock_mutex>::~unique_lock(&local_78);
  local_90._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       pstore::transaction_base::allocate((transaction_base *)local_68,8,8);
  pstore::typed_address<unsigned_long>::typed_address(&local_a8,(address)local_90._M_pi);
  local_a0 = pstore::make_extent<unsigned_long>(local_a8,8);
  _auStack_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.addr.a_.a_;
  extent.addr.a_.a_ = (address)(address)local_a0.size;
  pstore::transaction_base::getrw<unsigned_long,void>
            ((transaction_base *)&gtest_ar.message_,(extent<unsigned_long> *)local_68);
  peVar2 = std::__shared_ptr_access<unsigned_long,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<unsigned_long,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )&gtest_ar.message_);
  *peVar2 = 0x10000000000;
  std::shared_ptr<unsigned_long>::~shared_ptr((shared_ptr<unsigned_long> *)&gtest_ar.message_);
  pstore::transaction_base::commit((transaction_base *)local_68);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_68);
  pstore::database::getro<unsigned_long,void>
            ((database *)local_e0,(extent<unsigned_long> *)&(this->super_Transaction).db_);
  rhs = std::__shared_ptr_access<const_unsigned_long,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<const_unsigned_long,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)local_e0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_d0,"expected","*db_.getro (extent)",&extent.size,rhs);
  std::shared_ptr<const_unsigned_long>::~shared_ptr((shared_ptr<const_unsigned_long> *)local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x1e5,message);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  return;
}

Assistant:

TEST_F (Transaction, GetRwUInt64) {
    std::uint64_t const expected = 1ULL << 40;
    pstore::extent<std::uint64_t> extent;
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        {
            // Allocate the storage
            pstore::address const addr =
                transaction.allocate (sizeof (std::uint64_t), alignof (std::uint64_t));
            extent =
                make_extent (pstore::typed_address<std::uint64_t> (addr), sizeof (std::uint64_t));
            std::shared_ptr<std::uint64_t> ptr = transaction.getrw (extent);

            // Save the data to the store
            *(ptr) = expected;
        }
        transaction.commit ();
    }
    EXPECT_EQ (expected, *db_.getro (extent));
}